

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void __thiscall Fl_Widget_Type::resizable(Fl_Widget_Type *this,uchar v)

{
  Fl_Widget *pFVar1;
  int iVar2;
  Fl_Group *pFVar3;
  Fl_Group *pFVar4;
  undefined3 in_register_00000031;
  bool bVar5;
  
  iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])();
  pFVar1 = this->o;
  if (CONCAT31(in_register_00000031,v) == 0) {
    if (iVar2 == 0) {
      if (pFVar1->parent_ == (Fl_Group *)0x0) {
        return;
      }
      bVar5 = pFVar1->parent_->resizable_ == pFVar1;
    }
    else {
      bVar5 = pFVar1[1].callback_ != (Fl_Callback *)0x0;
    }
    if (!bVar5) {
      return;
    }
    iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
    pFVar3 = (Fl_Group *)this->o;
    if ((iVar2 == 0) && (pFVar3 = ((Fl_Widget *)pFVar3)->parent_, pFVar3 == (Fl_Group *)0x0)) {
      return;
    }
    pFVar4 = (Fl_Group *)0x0;
    goto LAB_00184807;
  }
  if (iVar2 == 0) {
    if (pFVar1->parent_ != (Fl_Group *)0x0) {
      bVar5 = pFVar1->parent_->resizable_ == pFVar1;
      goto LAB_001847a3;
    }
  }
  else {
    bVar5 = pFVar1[1].callback_ != (Fl_Callback *)0x0;
LAB_001847a3:
    if (bVar5) {
      return;
    }
  }
  iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
  pFVar4 = (Fl_Group *)this->o;
  pFVar3 = pFVar4;
  if ((iVar2 == 0) &&
     (pFVar3 = *(Fl_Group **)((long)&pFVar4->super_Fl_Widget + 8),
     *(Fl_Group **)((long)&pFVar4->super_Fl_Widget + 8) == (Fl_Group *)0x0)) {
    return;
  }
LAB_00184807:
  pFVar3->resizable_ = &pFVar4->super_Fl_Widget;
  return;
}

Assistant:

void Fl_Widget_Type::resizable(uchar v) {
  if (v) {
    if (resizable()) return;
    if (is_window()) ((Fl_Window*)o)->resizable(o);
    else {
      Fl_Group* p = (Fl_Group*)o->parent();
      if (p) p->resizable(o);
    }
  } else {
    if (!resizable()) return;
    if (is_window()) {
      ((Fl_Window*)o)->resizable(0);
    } else {
      Fl_Group* p = (Fl_Group*)o->parent();
      if (p) p->resizable(0);
    }
  }
}